

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-packed-test.c++
# Opt level: O0

size_t __thiscall
capnp::_::anon_unknown_0::TestPipe::tryRead
          (TestPipe *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  size_t __dest;
  long lVar1;
  WiderType<Decay<unsigned_long_&>,_Decay<unsigned_long_&>_> local_50;
  size_t local_48;
  size_t amount;
  Fault local_30;
  Fault f;
  size_t maxBytes_local;
  size_t minBytes_local;
  void *buffer_local;
  TestPipe *this_local;
  
  f.exception = (Exception *)maxBytes;
  maxBytes_local = minBytes;
  minBytes_local = (size_t)buffer;
  buffer_local = this;
  lVar1 = std::__cxx11::string::size();
  if (maxBytes <= lVar1 - this->readPos) {
    local_50 = kj::max<unsigned_long&,unsigned_long&>(&maxBytes_local,&this->preferredReadSize);
    local_48 = kj::min<unsigned_long&,unsigned_long>((unsigned_long *)&f,&local_50);
    __dest = minBytes_local;
    lVar1 = std::__cxx11::string::data();
    memcpy((void *)__dest,(void *)(lVar1 + this->readPos),local_48);
    this->readPos = local_48 + this->readPos;
    return local_48;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
            (&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-packed-test.c++"
             ,0x42,FAILED,"maxBytes <= data.size() - readPos","\"Overran end of stream.\"",
             (char (*) [23])"Overran end of stream.");
  kj::_::Debug::Fault::fatal(&local_30);
}

Assistant:

size_t tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    KJ_ASSERT(maxBytes <= data.size() - readPos, "Overran end of stream.");
    size_t amount = kj::min(maxBytes, kj::max(minBytes, preferredReadSize));
    memcpy(buffer, data.data() + readPos, amount);
    readPos += amount;
    return amount;
  }